

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

uint64_t hash_file_contents(io_buf *io,int f)

{
  int iVar1;
  int extraout_var;
  ssize_t i;
  long lVar2;
  uint64_t uVar3;
  uchar buf [1024];
  byte local_428 [1032];
  
  uVar3 = 0x4967a1cbaca3d988;
  while( true ) {
    iVar1 = (*io->_vptr_io_buf[5])(io,f,local_428);
    if (CONCAT44(extraout_var,iVar1) == 0 || extraout_var < 0) break;
    for (lVar2 = 0; CONCAT44(extraout_var,iVar1) != lVar2; lVar2 = lVar2 + 1) {
      uVar3 = (ulong)local_428[lVar2] + uVar3 * 0x145f4971;
    }
  }
  return uVar3;
}

Assistant:

uint64_t hash_file_contents(io_buf* io, int f)
{
  uint64_t v = 5289374183516789128;
  unsigned char buf[1024];
  while (true)
  {
    ssize_t n = io->read_file(f, buf, 1024);
    if (n <= 0)
      break;
    for (ssize_t i = 0; i < n; i++)
    {
      v *= 341789041;
      v += buf[i];
    }
  }
  return v;
}